

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

saint_t sufcheck(sauchar_t *T,saidx_t *SA,saidx_t n,saint_t verbose)

{
  uint uVar1;
  uint uVar2;
  byte extraout_AL;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  saint_t sVar7;
  byte bVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  saidx_t C [256];
  
  if (verbose == 0) {
    if (n < 0 || (SA == (saidx_t *)0x0 || T == (sauchar_t *)0x0)) {
      return -1;
    }
    if (n == 0) {
      return 0;
    }
  }
  else {
    sufcheck_cold_1();
    if ((extraout_AL & 1) != 0) {
      return C[0];
    }
  }
  uVar14 = (ulong)(uint)n;
  uVar5 = 0;
  do {
    if ((uint)n <= (uint)SA[uVar5]) {
      if (verbose == 0) {
        return -2;
      }
      fprintf(_stderr,"Out of the range [0,%d].\n  SA[%d]=%d\n",(ulong)(n - 1));
      return -2;
    }
    uVar5 = uVar5 + 1;
  } while (uVar14 != uVar5);
  if (n < 2) {
LAB_0010654a:
    uVar5 = 0;
    memset(C,0,0x400);
    do {
      C[T[uVar5]] = C[T[uVar5]] + 1;
      uVar5 = uVar5 + 1;
    } while (uVar14 != uVar5);
    lVar13 = 0;
    iVar4 = 0;
    do {
      iVar11 = C[lVar13];
      C[lVar13] = iVar4;
      lVar13 = lVar13 + 1;
      iVar4 = iVar11 + iVar4;
    } while (lVar13 != 0x100);
    bVar8 = T[n - 1U];
    uVar1 = C[bVar8];
    C[bVar8] = uVar1 + 1;
    uVar5 = 0;
    do {
      uVar9 = (ulong)bVar8;
      uVar2 = uVar1;
      uVar10 = n - 1U;
      if (0 < SA[uVar5]) {
        uVar10 = SA[uVar5] - 1;
        uVar9 = (ulong)T[uVar10];
        uVar2 = C[uVar9];
      }
      uVar6 = (ulong)uVar2;
      if (((int)uVar2 < 0) || (uVar10 != SA[uVar6])) {
        if (verbose == 0) {
          return -4;
        }
        uVar5 = 0xffffffff;
        if (-1 < (int)uVar2) {
          uVar5 = (ulong)(uint)SA[uVar6];
        }
        fprintf(_stderr,"Suffix in wrong position.\n  SA[%d]=%d or\n  SA[%d]=%d\n",uVar6,uVar5);
        return -4;
      }
      if (uVar2 != uVar1) {
        iVar4 = C[uVar9];
        iVar11 = iVar4 + 1;
        C[uVar9] = iVar11;
        if ((n <= iVar11) || (T[SA[(long)iVar4 + 1]] != (sauchar_t)uVar9)) {
          C[uVar9] = -1;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar14 != uVar5);
    sVar7 = 0;
    if (0 < verbose) {
      sufcheck_cold_2();
      sVar7 = 0;
    }
  }
  else {
    uVar5 = (ulong)*SA;
    bVar8 = T[uVar5];
    uVar1 = SA[1];
    lVar13 = (long)(int)uVar1;
    bVar3 = T[lVar13];
    if (bVar3 < bVar8) {
      lVar12 = 1;
    }
    else {
      lVar12 = 1;
      do {
        bVar8 = bVar3;
        uVar5 = (ulong)uVar1;
        if ((2 - uVar14) + lVar12 == 1) goto LAB_0010654a;
        uVar1 = SA[lVar12 + 1];
        lVar13 = (long)(int)uVar1;
        bVar3 = T[lVar13];
        lVar12 = lVar12 + 1;
      } while (bVar8 <= bVar3);
    }
    sVar7 = -3;
    if (verbose != 0) {
      fprintf(_stderr,"Suffixes in wrong order.\n  T[SA[%d]=%d]=%d > T[SA[%d]=%d]=%d\n",
              (ulong)((int)lVar12 - 1),uVar5,(ulong)bVar8,lVar12,lVar13,(ulong)bVar3);
    }
  }
  return sVar7;
}

Assistant:

saint_t
sufcheck(const sauchar_t *T, const saidx_t *SA,
         saidx_t n, saint_t verbose) {
  saidx_t C[ALPHABET_SIZE];
  saidx_t i, p, q, t;
  saint_t c;

  if(verbose) { fprintf(stderr, "sufcheck: "); }

  /* Check arguments. */
  if((T == NULL) || (SA == NULL) || (n < 0)) {
    if(verbose) { fprintf(stderr, "Invalid arguments.\n"); }
    return -1;
  }
  if(n == 0) {
    if(verbose) { fprintf(stderr, "Done.\n"); }
    return 0;
  }

  /* check range: [0..n-1] */
  for(i = 0; i < n; ++i) {
    if((SA[i] < 0) || (n <= SA[i])) {
      if(verbose) {
        fprintf(stderr, "Out of the range [0,%" PRIdSAIDX_T "].\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "\n",
                        n - 1, i, SA[i]);
      }
      return -2;
    }
  }

  /* check first characters. */
  for(i = 1; i < n; ++i) {
    if(T[SA[i - 1]] > T[SA[i]]) {
      if(verbose) {
        fprintf(stderr, "Suffixes in wrong order.\n"
                        "  T[SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "]=%d"
                        " > T[SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "]=%d\n",
                        i - 1, SA[i - 1], T[SA[i - 1]], i, SA[i], T[SA[i]]);
      }
      return -3;
    }
  }

  /* check suffixes. */
  for(i = 0; i < ALPHABET_SIZE; ++i) { C[i] = 0; }
  for(i = 0; i < n; ++i) { ++C[T[i]]; }
  for(i = 0, p = 0; i < ALPHABET_SIZE; ++i) {
    t = C[i];
    C[i] = p;
    p += t;
  }

  q = C[T[n - 1]];
  C[T[n - 1]] += 1;
  for(i = 0; i < n; ++i) {
    p = SA[i];
    if(0 < p) {
      c = T[--p];
      t = C[c];
    } else {
      c = T[p = n - 1];
      t = q;
    }
    if((t < 0) || (p != SA[t])) {
      if(verbose) {
        fprintf(stderr, "Suffix in wrong position.\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T " or\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "\n",
                        t, (0 <= t) ? SA[t] : -1, i, SA[i]);
      }
      return -4;
    }
    if(t != q) {
      ++C[c];
      if((n <= C[c]) || (T[SA[C[c]]] != c)) { C[c] = -1; }
    }
  }

  if(1 <= verbose) { fprintf(stderr, "Done.\n"); }
  return 0;
}